

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassignformat(bstring b,char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_48;
  int local_44;
  int r;
  int n;
  bstring buff;
  va_list arglist;
  char *fmt_local;
  bstring b_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((((b != (bstring)0x0) && (fmt != (char *)0x0)) && (b->data != (uchar *)0x0)) &&
     (((0 < b->mlen && (-1 < b->slen)) && (b->slen <= b->mlen)))) {
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    arglist[0].reg_save_area = fmt;
    sVar2 = strlen(fmt);
    local_44 = (int)(sVar2 << 1);
    if (local_44 < 0x10) {
      local_44 = 0x10;
    }
    _r = bfromcstralloc(local_44 + 2,"");
    if (_r == (bstring)0x0) {
      local_44 = 1;
      _r = bfromcstralloc(3,"");
      if (_r == (bstring)0x0) {
        return -1;
      }
    }
    do {
      arglist[0].overflow_arg_area = local_f8;
      arglist[0]._0_8_ = &stack0x00000008;
      buff._4_4_ = 0x30;
      buff._0_4_ = 0x10;
      local_48 = vsnprintf((char *)_r->data,(long)(local_44 + 1),(char *)arglist[0].reg_save_area,
                           &buff);
      _r->data[local_44] = '\0';
      sVar2 = strlen((char *)_r->data);
      _r->slen = (int)sVar2;
      if (_r->slen < local_44) {
        local_48 = bassign(b,_r);
        bdestroy(_r);
        return local_48;
      }
      if (local_44 < local_48) {
        local_44 = local_48;
      }
      else {
        local_44 = local_44 * 2;
      }
      iVar1 = balloc(_r,local_44 + 2);
    } while (iVar1 == 0);
    bdestroy(_r);
  }
  return -1;
}

Assistant:

int bassignformat (bstring b, const char * fmt, ...) {
va_list arglist;
bstring buff;
int n, r;

	if (b == NULL || fmt == NULL || b->data == NULL || b->mlen <= 0 
	 || b->slen < 0 || b->slen > b->mlen) return BSTR_ERR;

	/* Since the length is not determinable beforehand, a search is
	   performed using the truncating "vsnprintf" call (to avoid buffer
	   overflows) on increasing potential sizes for the output result. */

	if ((n = (int) (2*strlen (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
	if (NULL == (buff = bfromcstralloc (n + 2, ""))) {
		n = 1;
		if (NULL == (buff = bfromcstralloc (n + 2, ""))) return BSTR_ERR;
	}

	for (;;) {
		va_start (arglist, fmt);
		exvsnprintf (r, (char *) buff->data, n + 1, fmt, arglist);
		va_end (arglist);

		buff->data[n] = (unsigned char) '\0';
		buff->slen = (int) (strlen) ((char *) buff->data);

		if (buff->slen < n) break;

		if (r > n) n = r; else n += n;

		if (BSTR_OK != balloc (buff, n + 2)) {
			bdestroy (buff);
			return BSTR_ERR;
		}
	}

	r = bassign (b, buff);
	bdestroy (buff);
	return r;
}